

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::setupFunctionDebugInfo
          (Builder *this,Function *function,char *name,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes,
          vector<const_char_*,_std::allocator<const_char_*>_> *paramNames)

{
  ulong uVar1;
  bool bVar2;
  Id IVar3;
  mapped_type_conflict *pmVar4;
  size_type sVar5;
  size_type sVar6;
  const_reference pvVar7;
  Id local_b0;
  Id local_ac;
  Id paramId;
  Id debugLocalVariableId;
  value_type *paramName;
  Id paramTypeId;
  bool passByRef;
  size_t p;
  Id local_88;
  Id firstParamId;
  Id debugFuncId;
  Id funcId;
  Id funcTypeId;
  string local_58;
  Id local_34;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvStack_30;
  Id nameId;
  vector<const_char_*,_std::allocator<const_char_*>_> *paramNames_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes_local;
  char *name_local;
  Function *function_local;
  Builder *this_local;
  
  if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
    pvStack_30 = paramNames;
    paramNames_local = (vector<const_char_*,_std::allocator<const_char_*>_> *)paramTypes;
    paramTypes_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)name;
    name_local = (char *)function;
    function_local = (Function *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&funcTypeId,name,(allocator<char> *)((long)&funcId + 3));
    unmangleFunctionName(&local_58,this,(string *)&funcTypeId);
    IVar3 = getStringId(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&funcTypeId);
    std::allocator<char>::~allocator((allocator<char> *)((long)&funcId + 3));
    local_34 = IVar3;
    debugFuncId = spv::Function::getFuncTypeId((Function *)name_local);
    pmVar4 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&debugFuncId);
    if (*pmVar4 == 0) {
      __assert_fail("debugId[funcTypeId] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x918,
                    "void spv::Builder::setupFunctionDebugInfo(Function *, const char *, const std::vector<Id> &, const std::vector<const char *> &)"
                   );
    }
    firstParamId = spv::Function::getId((Function *)name_local);
    if (firstParamId == 0) {
      __assert_fail("funcId != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x91b,
                    "void spv::Builder::setupFunctionDebugInfo(Function *, const char *, const std::vector<Id> &, const std::vector<const char *> &)"
                   );
    }
    IVar3 = makeDebugFunction(this,(Function *)name_local,local_34,debugFuncId);
    local_88 = IVar3;
    pmVar4 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&firstParamId);
    *pmVar4 = IVar3;
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              (&this->currentDebugScopeId,&local_88);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paramNames_local);
    sVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(pvStack_30);
    if (sVar5 != sVar6) {
      __assert_fail("paramTypes.size() == paramNames.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x923,
                    "void spv::Builder::setupFunctionDebugInfo(Function *, const char *, const std::vector<Id> &, const std::vector<const char *> &)"
                   );
    }
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paramNames_local);
    if (0 < (int)sVar5) {
      p._4_4_ = spv::Function::getParamId((Function *)name_local,0);
      for (_paramTypeId = 0; uVar1 = _paramTypeId,
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paramNames_local
                            ), uVar1 < sVar5; _paramTypeId = _paramTypeId + 1) {
        paramName._7_1_ = 0;
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paramNames_local,
                            _paramTypeId);
        paramName._0_4_ = *pvVar7;
        bVar2 = isPointerType(this,(Id)paramName);
        if ((bVar2) || (bVar2 = isArrayType(this,(Id)paramName), bVar2)) {
          paramName._7_1_ = 1;
          paramName._0_4_ = getContainedTypeId(this,(Id)paramName);
        }
        _paramId = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                             (pvStack_30,_paramTypeId);
        pmVar4 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,(key_type_conflict *)&paramName);
        IVar3 = createDebugLocalVariable(this,*pmVar4,*_paramId,_paramTypeId + 1);
        local_b0 = p._4_4_ + (int)_paramTypeId;
        local_ac = IVar3;
        pmVar4 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,&local_b0);
        *pmVar4 = IVar3;
        if ((paramName._7_1_ & 1) == 0) {
          makeDebugValue(this,local_ac,local_b0);
        }
        else {
          makeDebugDeclare(this,local_ac,local_b0);
        }
      }
    }
    if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
      std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                (&this->currentDebugScopeId);
    }
  }
  return;
}

Assistant:

void Builder::setupFunctionDebugInfo(Function* function, const char* name, const std::vector<Id>& paramTypes,
                                     const std::vector<char const*>& paramNames)
{

    if (!emitNonSemanticShaderDebugInfo)
        return;

    Id nameId = getStringId(unmangleFunctionName(name));
    Id funcTypeId = function->getFuncTypeId();
    assert(debugId[funcTypeId] != 0);
    Id funcId = function->getId();

    assert(funcId != 0);

    // Make the debug function instruction
    Id debugFuncId = makeDebugFunction(function, nameId, funcTypeId);
    debugId[funcId] = debugFuncId;
    currentDebugScopeId.push(debugFuncId);

    // DebugScope and DebugLine for parameter DebugDeclares
    assert(paramTypes.size() == paramNames.size());
    if ((int)paramTypes.size() > 0) {
        Id firstParamId = function->getParamId(0);

        for (size_t p = 0; p < paramTypes.size(); ++p) {
            bool passByRef = false;
            Id paramTypeId = paramTypes[p];

            // For pointer-typed parameters, they are actually passed by reference and we need unwrap the pointer to get the actual parameter type.
            if (isPointerType(paramTypeId) || isArrayType(paramTypeId)) {
                passByRef = true;
                paramTypeId = getContainedTypeId(paramTypeId);
            }

            auto const& paramName = paramNames[p];
            auto const debugLocalVariableId = createDebugLocalVariable(debugId[paramTypeId], paramName, p + 1);
            auto const paramId = static_cast<Id>(firstParamId + p);
            debugId[paramId] = debugLocalVariableId;

            if (passByRef) {
                makeDebugDeclare(debugLocalVariableId, paramId);
            } else {
                makeDebugValue(debugLocalVariableId, paramId);
            }
        }
    }

    // Clear debug scope stack
    if (emitNonSemanticShaderDebugInfo)
        currentDebugScopeId.pop();
}